

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

int compute_string_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  char *pcVar4;
  size_t sVar5;
  int iVar6;
  Am_String string;
  Am_Object screen;
  Am_Font font;
  Am_String AStack_28;
  Am_Object local_20;
  Am_Font local_18;
  
  pAVar3 = Am_Object::Get(self,0xac,0);
  Am_Font::Am_Font(&local_18,pAVar3);
  pAVar3 = Am_Object::Get(self,0xab,0);
  Am_String::Am_String(&AStack_28,pAVar3);
  bVar1 = Am_String::Valid(&AStack_28);
  iVar6 = 10;
  if (bVar1) {
    Am_GV_Screen(&local_20);
    pcVar4 = Am_String::operator_cast_to_char_(&AStack_28);
    sVar5 = strlen(pcVar4);
    pcVar4 = Am_String::operator_cast_to_char_(&AStack_28);
    iVar2 = Am_Get_String_Width(&local_20,&local_18,pcVar4,(int)sVar5);
    iVar6 = 10;
    if (10 < iVar2) {
      iVar6 = iVar2;
    }
    Am_Object::~Am_Object(&local_20);
  }
  Am_String::~Am_String(&AStack_28);
  Am_Font::~Am_Font(&local_18);
  return iVar6;
}

Assistant:

Am_Define_Formula(int, compute_string_width)
{
  Am_Font font(self.Get(Am_FONT));
  Am_String string(self.Get(Am_TEXT));

  if (string.Valid()) {
    Am_Object screen = Am_GV_Screen(self);
    int str_len = strlen(string);
    int width = Am_Get_String_Width(screen, font, string, str_len);

    // assure text boxes are always at least 10 pixels wide so you can click
    return width > 10 ? width : 10;
  } else
    return 10;
}